

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O1

void linsolve(double *A,int N,double *b,int *ipiv,double *x)

{
  double *pdVar1;
  double *pdVar2;
  ulong uVar3;
  double *__ptr;
  double *pdVar4;
  ulong uVar5;
  double *pdVar6;
  ulong uVar7;
  int iVar8;
  long lVar9;
  double dVar10;
  
  uVar3 = (ulong)(uint)N;
  lVar9 = (long)N;
  __ptr = (double *)malloc(lVar9 * 8);
  if (0 < N) {
    iVar8 = 0;
    uVar7 = 0;
    do {
      __ptr[uVar7] = 0.0;
      x[uVar7] = 0.0;
      if ((A[iVar8] == 0.0) && (!NAN(A[iVar8]))) {
        printf("Warning : The Matrix system does not have a unique solution");
      }
      uVar7 = uVar7 + 1;
      iVar8 = iVar8 + N + 1;
    } while (uVar3 != uVar7);
  }
  *__ptr = b[*ipiv];
  if (1 < N) {
    pdVar4 = A + uVar3;
    uVar7 = 1;
    do {
      dVar10 = 0.0;
      uVar5 = 0;
      do {
        dVar10 = dVar10 + __ptr[uVar5] * pdVar4[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar7 != uVar5);
      __ptr[uVar7] = b[ipiv[uVar7]] - dVar10;
      uVar7 = uVar7 + 1;
      pdVar4 = pdVar4 + uVar3;
    } while (uVar7 != uVar3);
  }
  x[lVar9 + -1] = __ptr[lVar9 + -1] / A[(ulong)(uint)(N * N) - 1];
  if (1 < N) {
    lVar9 = (long)(N + -2);
    pdVar6 = A + lVar9 * (uVar3 + 1) + 1;
    pdVar4 = x + (N - 1);
    uVar7 = 1;
    do {
      dVar10 = 0.0;
      if (lVar9 < (long)(uVar3 - 1)) {
        uVar5 = 0;
        do {
          pdVar1 = pdVar6 + uVar5;
          pdVar2 = pdVar4 + uVar5;
          uVar5 = uVar5 + 1;
          dVar10 = dVar10 + *pdVar1 * *pdVar2;
        } while (uVar7 != uVar5);
      }
      x[lVar9] = (__ptr[lVar9] - dVar10) / A[lVar9 * (uVar3 + 1)];
      lVar9 = lVar9 + -1;
      uVar7 = uVar7 + 1;
      pdVar6 = (double *)((long)pdVar6 - (uVar3 * 8 + 8));
      pdVar4 = pdVar4 + -1;
    } while (uVar7 != uVar3);
  }
  free(__ptr);
  return;
}

Assistant:

void linsolve(double *A,int N,double *b,int *ipiv,double *x) {
	int i,j,c1,l;
	double *y;
	double sum;
	
	y = (double*) malloc(sizeof(double) *N);
	/*
	 * Two step Solution L * U * x = b
	 * Let U*x = y
	 * Solve L * y = b for y (Forward Substitution
	 * Solve U * x = b for x (Back Substitution)
	 */ 
	for(i = 0; i < N;++i) {
		y[i] = 0.;
		x[i] = 0.;
		if ( A[i*N + i] == 0.) {
			printf("Warning : The Matrix system does not have a unique solution");
			//exit(1);
		}
		//printf("\n B %d",ipiv[i]);
	}
	
	// Forward Substitution
	
	y[0] = b[ipiv[0]];
	for(i = 1; i < N; ++i) {
		sum = 0.;
		c1 = i*N;
		for(j = 0; j < i; ++j) {
			sum += y[j] * A[c1 + j];
		}
		y[i] = b[ipiv[i]] - sum;
	}
	
	// Back Substitution
	
	x[N - 1] = y[N - 1]/A[N * N - 1];
	
	for (i = N - 2; i >= 0; i--) {
		sum = 0.;
		c1 = i*(N+1);
		l=0;
		for(j = i+1; j < N;j++) {
			l++;
			sum += A[c1 + l] * x[j];
		}
		x[i] = (y[i] - sum) / A[c1];
	}
	
	free(y);
}